

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O2

void __thiscall dg::BBlock<dg::LLVMNode>::removeSuccessors(BBlock<dg::LLVMNode> *this)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::erase
              ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)(*(long *)(p_Var1 + 1) + 0x58),this);
  }
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
  ::clear((_Rb_tree<dg::BBlock<dg::LLVMNode>::BBlockEdge,_dg::BBlock<dg::LLVMNode>::BBlockEdge,_std::_Identity<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::less<dg::BBlock<dg::LLVMNode>::BBlockEdge>,_std::allocator<dg::BBlock<dg::LLVMNode>::BBlockEdge>_>
           *)&this->nextBBs);
  return;
}

Assistant:

void removeSuccessors() {
        // remove references to this node from successors
        for (const BBlockEdge &succ : nextBBs) {
            // This assertion does not hold anymore, since if we have
            // two edges with different labels to the same successor,
            // and we remove the successor, then we remove 'this'
            // from prevBBs twice. If we'll add labels even to predecessors,
            // this assertion must hold again
            // bool ret = succ.target->prevBBs.erase(this);
            // assert(ret && "Did not have this BB in successor's pred");
            succ.target->prevBBs.erase(this);
        }

        nextBBs.clear();
    }